

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetPropertyCommand.cxx
# Opt level: O0

bool __thiscall cmGetPropertyCommand::HandleTargetMode(cmGetPropertyCommand *this)

{
  bool bVar1;
  TargetType tgtType;
  ulong uVar2;
  cmTarget *this_00;
  char *value;
  cmMessenger *messenger_00;
  ostream *poVar3;
  string local_220;
  ostringstream local_200 [8];
  ostringstream e;
  cmMessenger *messenger;
  cmListFileBacktrace bt;
  char *prop_cstr;
  cmTarget *target;
  allocator local_39;
  string local_38;
  cmGetPropertyCommand *local_18;
  cmGetPropertyCommand *this_local;
  
  local_18 = this;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    this_00 = cmMakefile::FindTargetToUse((this->super_cmCommand).Makefile,&this->Name,false);
    if (this_00 == (cmTarget *)0x0) {
      std::__cxx11::ostringstream::ostringstream(local_200);
      poVar3 = std::operator<<((ostream *)local_200,"could not find TARGET ");
      poVar3 = std::operator<<(poVar3,(string *)&this->Name);
      std::operator<<(poVar3,".  Perhaps it has not yet been created.");
      std::__cxx11::ostringstream::str();
      cmCommand::SetError(&this->super_cmCommand,&local_220);
      std::__cxx11::string::~string((string *)&local_220);
      this_local._7_1_ = 0;
      std::__cxx11::ostringstream::~ostringstream(local_200);
    }
    else {
      bVar1 = std::operator==(&this->PropertyName,"ALIASED_TARGET");
      if (bVar1) {
        bVar1 = cmMakefile::IsAlias((this->super_cmCommand).Makefile,&this->Name);
        if (bVar1) {
          cmTarget::GetName_abi_cxx11_(this_00);
          value = (char *)std::__cxx11::string::c_str();
          this_local._7_1_ = StoreResult(this,value);
        }
        else {
          this_local._7_1_ = StoreResult(this,(char *)0x0);
        }
      }
      else {
        bt.Cur = (Entry *)0x0;
        cmMakefile::GetBacktrace((cmListFileBacktrace *)&messenger,(this->super_cmCommand).Makefile)
        ;
        messenger_00 = cmMakefile::GetMessenger((this->super_cmCommand).Makefile);
        tgtType = cmTarget::GetType(this_00);
        bVar1 = cmTargetPropertyComputer::PassesWhitelist
                          (tgtType,&this->PropertyName,messenger_00,
                           (cmListFileBacktrace *)&messenger);
        if ((bVar1) &&
           (bt.Cur = (Entry *)cmTarget::GetComputedProperty
                                        (this_00,&this->PropertyName,messenger_00,
                                         (cmListFileBacktrace *)&messenger), bt.Cur == (Entry *)0x0)
           ) {
          bt.Cur = (Entry *)cmTarget::GetProperty(this_00,&this->PropertyName);
        }
        this_local._7_1_ = StoreResult(this,(char *)bt.Cur);
        cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&messenger);
      }
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_38,"not given name for TARGET scope.",&local_39);
    cmCommand::SetError(&this->super_cmCommand,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmGetPropertyCommand::HandleTargetMode()
{
  if (this->Name.empty()) {
    this->SetError("not given name for TARGET scope.");
    return false;
  }

  if (cmTarget* target = this->Makefile->FindTargetToUse(this->Name)) {
    if (this->PropertyName == "ALIASED_TARGET") {
      if (this->Makefile->IsAlias(this->Name)) {
        return this->StoreResult(target->GetName().c_str());
      }
      return this->StoreResult(CM_NULLPTR);
    }
    const char* prop_cstr = CM_NULLPTR;
    cmListFileBacktrace bt = this->Makefile->GetBacktrace();
    cmMessenger* messenger = this->Makefile->GetMessenger();
    if (cmTargetPropertyComputer::PassesWhitelist(
          target->GetType(), this->PropertyName, messenger, bt)) {
      prop_cstr =
        target->GetComputedProperty(this->PropertyName, messenger, bt);
      if (!prop_cstr) {
        prop_cstr = target->GetProperty(this->PropertyName);
      }
    }
    return this->StoreResult(prop_cstr);
  }
  std::ostringstream e;
  e << "could not find TARGET " << this->Name
    << ".  Perhaps it has not yet been created.";
  this->SetError(e.str());
  return false;
}